

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  size_t __n;
  int iVar1;
  int iVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_x509_crt *pmVar4;
  uchar *puVar5;
  size_t sVar6;
  mbedtls_asn1_sequence *pmVar7;
  ulong uVar8;
  byte *pbVar9;
  mbedtls_x509_crt *pmVar10;
  uint uVar11;
  uchar *puVar12;
  uint *end;
  uchar *p;
  uchar local_131;
  int *local_130;
  uchar *local_128;
  int local_11c;
  size_t len;
  mbedtls_asn1_sequence *local_110;
  int *local_108;
  uint local_100;
  int is_critical;
  size_t len_2;
  uchar uStack_f0;
  undefined7 uStack_ef;
  byte *local_e8;
  uchar *local_d8;
  int *local_d0;
  size_t len_1;
  size_t local_c0;
  mbedtls_x509_buf extn_oid;
  mbedtls_x509_buf sig_params1;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf sig_params2;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar3 = (mbedtls_x509_crt *)0x0;
  pmVar4 = chain;
  do {
    pmVar10 = pmVar4;
    if (pmVar10->version == 0) goto LAB_0013e444;
    pmVar3 = pmVar10;
    pmVar4 = pmVar10->next;
  } while (pmVar10->next != (mbedtls_x509_crt *)0x0);
  pmVar4 = (mbedtls_x509_crt *)calloc(1,0x228);
  pmVar10->next = pmVar4;
  if (pmVar4 == (mbedtls_x509_crt *)0x0) {
    return -0x2880;
  }
  memset(pmVar4,0,0x228);
  pmVar10 = pmVar10->next;
LAB_0013e444:
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  sig_params1.p = (uchar *)0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  sig_params2.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  if (pmVar10 == (mbedtls_x509_crt *)0x0) {
    iVar1 = -0x2800;
    goto LAB_0013e63c;
  }
  len = buflen;
  puVar5 = (uchar *)calloc(1,buflen);
  p = puVar5;
  if (puVar5 == (uchar *)0x0) {
    iVar1 = -0x2880;
    goto LAB_0013e63c;
  }
  memcpy(puVar5,buf,buflen);
  (pmVar10->raw).p = puVar5;
  (pmVar10->raw).len = buflen;
  puVar5 = puVar5 + buflen;
  iVar1 = mbedtls_asn1_get_tag(&p,puVar5,&len,0x30);
  sVar6 = len;
  puVar12 = p;
  if (iVar1 != 0) {
    mbedtls_x509_crt_free(pmVar10);
    iVar1 = -0x2180;
    goto LAB_0013e63c;
  }
  if ((ulong)((long)puVar5 - (long)p) < len) goto LAB_0013e517;
  (pmVar10->tbs).p = p;
  iVar1 = mbedtls_asn1_get_tag(&p,puVar5,&len,0x30);
  if (iVar1 != 0) {
LAB_0013e547:
    mbedtls_x509_crt_free(pmVar10);
    iVar1 = iVar1 + -0x2180;
    if (iVar1 == 0) {
      return 0;
    }
    goto LAB_0013e63c;
  }
  local_128 = p + len;
  (pmVar10->tbs).len = (long)local_128 - (long)(pmVar10->tbs).p;
  local_130 = &pmVar10->version;
  iVar1 = mbedtls_asn1_get_tag(&p,local_128,&len_2,0xa0);
  if (iVar1 == 0) {
    local_d8 = puVar12;
    puVar5 = p + len_2;
    iVar1 = mbedtls_asn1_get_int(&p,puVar5,local_130);
    puVar12 = local_d8;
    if (iVar1 != 0) {
      iVar1 = iVar1 + -0x2200;
      goto LAB_0013e5ee;
    }
    if (p == puVar5) goto LAB_0013e5f3;
    iVar1 = -0x2266;
  }
  else {
    if (iVar1 == -0x62) {
      *local_130 = 0;
    }
    else {
LAB_0013e5ee:
      if (iVar1 != 0) goto LAB_0013e634;
    }
LAB_0013e5f3:
    iVar1 = mbedtls_x509_get_serial(&p,local_128,&pmVar10->serial);
    if (iVar1 == 0) {
      local_d8 = (uchar *)sVar6;
      iVar1 = mbedtls_x509_get_alg(&p,local_128,&pmVar10->sig_oid,&sig_params1);
      if (iVar1 == 0) {
        uVar11 = *local_130;
        *local_130 = uVar11 + 1;
        if (2 < (int)uVar11) {
          mbedtls_x509_crt_free(pmVar10);
          iVar1 = -0x2580;
          goto LAB_0013e63c;
        }
        iVar1 = mbedtls_x509_get_sig_alg
                          (&pmVar10->sig_oid,&sig_params1,&pmVar10->sig_md,&pmVar10->sig_pk,
                           &pmVar10->sig_opts);
        if (iVar1 == 0) {
          (pmVar10->issuer_raw).p = p;
          iVar1 = mbedtls_asn1_get_tag(&p,local_128,&len,0x30);
          if (iVar1 != 0) goto LAB_0013e547;
          iVar1 = mbedtls_x509_get_name(&p,p + len,&pmVar10->issuer);
          if (iVar1 == 0) {
            (pmVar10->issuer_raw).len = (long)p - (long)(pmVar10->issuer_raw).p;
            iVar1 = mbedtls_asn1_get_tag(&p,local_128,&len_2,0x30);
            if (iVar1 == 0) {
              puVar5 = p + len_2;
              iVar1 = mbedtls_x509_get_time(&p,puVar5,&pmVar10->valid_from);
              if (((iVar1 == 0) &&
                  (iVar1 = mbedtls_x509_get_time(&p,puVar5,&pmVar10->valid_to), iVar1 == 0)) &&
                 (iVar1 = -0x2466, p == puVar5)) goto LAB_0013e75a;
            }
            else {
              iVar1 = iVar1 + -0x2400;
              if (iVar1 == 0) {
LAB_0013e75a:
                (pmVar10->subject_raw).p = p;
                iVar1 = mbedtls_asn1_get_tag(&p,local_128,&len,0x30);
                if (iVar1 != 0) goto LAB_0013e547;
                if ((len == 0) ||
                   (iVar1 = mbedtls_x509_get_name(&p,p + len,&pmVar10->subject), iVar1 == 0)) {
                  (pmVar10->subject_raw).len = (long)p - (long)(pmVar10->subject_raw).p;
                  iVar1 = mbedtls_pk_parse_subpubkey(&p,local_128,&pmVar10->pk);
                  if (iVar1 == 0) {
                    uVar11 = *local_130;
                    if ((uVar11 & 0xfffffffe) == 2) {
                      iVar1 = x509_get_uid(&p,local_128,&pmVar10->issuer_id,1);
                      if (iVar1 != 0) goto LAB_0013e634;
                      uVar11 = *local_130;
                    }
                    if ((uVar11 & 0xfffffffe) == 2) {
                      iVar1 = x509_get_uid(&p,local_128,&pmVar10->subject_id,2);
                      if (iVar1 != 0) goto LAB_0013e634;
                      if ((*local_130 == 3) &&
                         (iVar1 = mbedtls_x509_get_ext(&p,local_128,&pmVar10->v3_ext,3),
                         iVar1 != -0x62)) {
                        if (iVar1 == 0) {
                          local_108 = &pmVar10->ca_istrue;
                          local_d0 = &pmVar10->max_pathlen;
LAB_0013e8ac:
                          do {
                            if (local_128 <= p) {
                              if (p == local_128) goto LAB_0013edf1;
                              iVar1 = -0x2566;
                              goto LAB_0013e634;
                            }
                            extn_oid.p = (uchar *)0x0;
                            is_critical = 0;
                            extn_oid.tag = 0;
                            extn_oid._4_4_ = 0;
                            extn_oid.len = 0;
                            local_100 = 0;
                            iVar1 = mbedtls_asn1_get_tag(&p,local_128,&len_1,0x30);
                            if (iVar1 != 0) {
LAB_0013eda3:
                              iVar1 = iVar1 + -0x2500;
                              goto LAB_0013ede8;
                            }
                            end = (uint *)(p + len_1);
                            extn_oid.tag = (uint)*p;
                            iVar1 = mbedtls_asn1_get_tag(&p,local_128,&extn_oid.len,6);
                            if (iVar1 != 0) goto LAB_0013eda3;
                            extn_oid.p = p;
                            p = p + extn_oid.len;
                            if (local_128 == p || (long)local_128 - (long)p < 0) {
                              iVar1 = -0x2560;
                              goto LAB_0013ede8;
                            }
                            iVar1 = mbedtls_asn1_get_bool(&p,(uchar *)end,&is_critical);
                            if (((iVar1 != -0x62) && (iVar1 != 0)) ||
                               (iVar1 = mbedtls_asn1_get_tag(&p,(uchar *)end,&len_1,4), iVar1 != 0))
                            goto LAB_0013eda3;
                            local_130 = (int *)(p + len_1);
                            iVar1 = -0x2566;
                            if ((uint *)local_130 != end) goto LAB_0013ede8;
                            iVar1 = mbedtls_oid_get_x509_ext_type(&extn_oid,(int *)&local_100);
                            if (iVar1 == 0) {
                              if ((local_100 & pmVar10->ext_types) != 0) {
                                iVar1 = -0x2500;
                                goto LAB_0013ede8;
                              }
                              pmVar10->ext_types = pmVar10->ext_types | local_100;
                              if (local_100 == 4) {
                                len_2 = 0;
                                uStack_f0 = '\0';
                                uStack_ef = 0;
                                local_e8 = (byte *)0x0;
                                iVar2 = mbedtls_asn1_get_bitstring
                                                  (&p,(uchar *)local_130,
                                                   (mbedtls_asn1_bitstring *)&len_2);
                                if (iVar2 == 0) {
                                  if (len_2 == 0) goto LAB_0013eec0;
                                  pmVar10->key_usage = 0;
                                  sVar6 = len_2;
                                  if (3 < len_2) {
                                    sVar6 = 4;
                                  }
                                  uVar11 = 0;
                                  pbVar9 = local_e8;
                                  for (uVar8 = 0; (uint)((int)sVar6 << 3) != uVar8;
                                      uVar8 = uVar8 + 8) {
                                    uVar11 = uVar11 | (uint)*pbVar9 << ((byte)uVar8 & 0x1f);
                                    pmVar10->key_usage = uVar11;
                                    pbVar9 = pbVar9 + 1;
                                  }
                                  goto LAB_0013e8ac;
                                }
                              }
                              else if (local_100 == 0x20) {
                                iVar2 = mbedtls_asn1_get_tag(&p,(uchar *)local_130,&len_2,0x30);
                                if (iVar2 == 0) {
                                  local_11c = -0x2566;
                                  iVar1 = local_11c;
                                  pmVar7 = &pmVar10->subject_alt_names;
                                  if ((uint *)(p + len_2) != end) goto LAB_0013ede8;
                                  while (local_110 = pmVar7, p < end) {
                                    if (end == (uint *)p || (long)end - (long)p < 0) {
                                      local_11c = -0x2560;
                                      iVar1 = local_11c;
                                      goto LAB_0013ede8;
                                    }
                                    local_131 = *p;
                                    p = p + 1;
                                    iVar2 = mbedtls_asn1_get_len(&p,(uchar *)local_130,&local_c0);
                                    if (iVar2 != 0) goto LAB_0013ed0a;
                                    if (-1 < (char)local_131) {
                                      local_11c = -0x2562;
                                      iVar1 = local_11c;
                                      goto LAB_0013ede8;
                                    }
                                    if (local_131 == 0x82) {
                                      if ((local_110->buf).p != (uchar *)0x0) {
                                        if (local_110->next != (mbedtls_asn1_sequence *)0x0) {
                                          local_11c = -0x2500;
                                          iVar1 = local_11c;
                                          goto LAB_0013ede8;
                                        }
                                        pmVar7 = (mbedtls_asn1_sequence *)calloc(1,0x20);
                                        local_110->next = pmVar7;
                                        local_110 = pmVar7;
                                        if (pmVar7 == (mbedtls_asn1_sequence *)0x0) {
                                          local_11c = -0x256a;
                                          iVar1 = local_11c;
                                          goto LAB_0013ede8;
                                        }
                                      }
                                      (local_110->buf).tag = 0x82;
                                      (local_110->buf).p = p;
                                      (local_110->buf).len = local_c0;
                                      p = p + local_c0;
                                      pmVar7 = local_110;
                                    }
                                    else {
                                      p = p + local_c0;
                                      pmVar7 = local_110;
                                    }
                                  }
                                  local_110->next = (mbedtls_asn1_sequence *)0x0;
                                  iVar1 = local_11c;
                                  if ((uint *)p != end) goto LAB_0013ede8;
                                  goto LAB_0013e8ac;
                                }
                              }
                              else if (local_100 == 0x10000) {
                                len_2 = 0;
                                uStack_f0 = '\0';
                                uStack_ef = 0;
                                local_e8 = (byte *)0x0;
                                iVar2 = mbedtls_asn1_get_bitstring
                                                  (&p,(uchar *)local_130,
                                                   (mbedtls_asn1_bitstring *)&len_2);
                                if (iVar2 == 0) {
                                  if (len_2 != 1) {
LAB_0013eec0:
                                    iVar1 = -0x2564;
                                    goto LAB_0013ede8;
                                  }
                                  pmVar10->ns_cert_type = *local_e8;
                                  goto LAB_0013e8ac;
                                }
                              }
                              else if (local_100 == 0x800) {
                                iVar2 = mbedtls_asn1_get_sequence_of
                                                  (&p,(uchar *)local_130,&pmVar10->ext_key_usage,6);
                                if (iVar2 == 0) {
                                  if ((pmVar10->ext_key_usage).buf.p == (uchar *)0x0)
                                  goto LAB_0013eec0;
                                  goto LAB_0013e8ac;
                                }
                              }
                              else {
                                if (local_100 != 0x100) {
                                  iVar1 = -0x2080;
                                  goto LAB_0013ede8;
                                }
                                *local_108 = 0;
                                *local_d0 = 0;
                                iVar2 = mbedtls_asn1_get_tag(&p,(uchar *)local_130,&len_2,0x30);
                                if (iVar2 == 0) {
                                  if ((uint *)p == end) goto LAB_0013e8ac;
                                  iVar2 = mbedtls_asn1_get_bool(&p,(uchar *)local_130,local_108);
                                  if (iVar2 != 0) {
                                    if (iVar2 == -0x62) {
                                      iVar2 = mbedtls_asn1_get_int(&p,(uchar *)local_130,local_108);
                                    }
                                    if (iVar2 != 0) goto LAB_0013ed0a;
                                    if (*local_108 != 0) {
                                      *local_108 = 1;
                                    }
                                  }
                                  if ((uint *)p == end) goto LAB_0013e8ac;
                                  iVar2 = mbedtls_asn1_get_int(&p,(uchar *)local_130,local_d0);
                                  if (iVar2 == 0) {
                                    if ((uint *)p != end) {
                                      iVar1 = -0x2566;
                                      goto LAB_0013ede8;
                                    }
                                    *local_d0 = *local_d0 + 1;
                                    goto LAB_0013e8ac;
                                  }
                                }
                              }
LAB_0013ed0a:
                              iVar1 = iVar2 + -0x2500;
                              if (iVar2 + -0x2500 != 0) goto LAB_0013ede8;
                              goto LAB_0013e8ac;
                            }
                            p = (uchar *)local_130;
                          } while (is_critical == 0);
                          iVar1 = -0x2562;
                        }
LAB_0013ede8:
                        if (iVar1 != 0) goto LAB_0013e634;
                      }
                    }
LAB_0013edf1:
                    if (p != local_128) {
LAB_0013e517:
                      mbedtls_x509_crt_free(pmVar10);
                      iVar1 = -0x21e6;
                      goto LAB_0013e63c;
                    }
                    puVar12 = puVar12 + (long)local_d8;
                    iVar1 = mbedtls_x509_get_alg(&p,puVar12,&local_68,&sig_params2);
                    if (iVar1 == 0) {
                      __n = (pmVar10->sig_oid).len;
                      if (((__n != local_68.len) ||
                          (iVar1 = bcmp((pmVar10->sig_oid).p,local_68.p,__n), iVar1 != 0)) ||
                         ((sig_params1.len != sig_params2.len ||
                          ((sig_params1.len != 0 &&
                           (iVar1 = bcmp(sig_params1.p,sig_params2.p,sig_params1.len), iVar1 != 0)))
                          ))) {
                        mbedtls_x509_crt_free(pmVar10);
                        iVar1 = -0x2680;
                        goto LAB_0013e63c;
                      }
                      iVar1 = mbedtls_x509_get_sig(&p,puVar12,&pmVar10->sig);
                      if (iVar1 == 0) {
                        if (p == puVar12) {
                          return 0;
                        }
                        goto LAB_0013e517;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0013e634:
  mbedtls_x509_crt_free(pmVar10);
LAB_0013e63c:
  if (pmVar3 != (mbedtls_x509_crt *)0x0) {
    pmVar3->next = (mbedtls_x509_crt *)0x0;
  }
  if (pmVar10 != chain) {
    free(pmVar10);
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}